

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

void __thiscall ghc::filesystem::path::~path(path *this)

{
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

GHC_INLINE path::~path() {}